

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::DotProduct::dim_forward(DotProduct *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *this_00;
  invalid_argument *this_01;
  const_reference pvVar5;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  Dim *in_stack_ffffffffffffff98;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint b;
  Dim *this_02;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  undefined1 *puVar7;
  
  this_02 = in_RDI;
  sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  b = (uint)((ulong)in_RDI >> 0x20);
  if (sVar3 == 2) {
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    bVar1 = LooksLikeVector(in_stack_ffffffffffffff98);
    if (bVar1) {
      std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
      bVar1 = LooksLikeVector(in_stack_ffffffffffffff98);
      if (bVar1) {
        pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
        in_stack_ffffffffffffffb4 = Dim::rows(pvVar4);
        pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
        uVar2 = Dim::rows(pvVar4);
        if (in_stack_ffffffffffffffb4 == uVar2) {
          uVar6 = 1;
          puVar7 = &stack0xffffffffffffffcc;
          pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
          pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
          std::max<unsigned_int>(&pvVar4->bd,&pvVar5->bd);
          x._M_array._4_4_ = uVar6;
          x._M_array._0_4_ = in_stack_ffffffffffffffc8;
          x._M_len = (size_type)puVar7;
          Dim::Dim(this_02,x,b);
          return this_02;
        }
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad arguments to DotProduct: ");
  this_00 = cnn::operator<<((ostream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            ,in_stack_ffffffffffffffa8);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"Bad arguments to DotProduct");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim DotProduct::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 ||
      !LooksLikeVector(xs[0]) ||
      !LooksLikeVector(xs[1]) ||
      xs[0].rows() != xs[1].rows()) {
    cerr << "Bad arguments to DotProduct: " << xs << endl;
    throw std::invalid_argument("Bad arguments to DotProduct");
  }
  return Dim({1}, max(xs[0].bd, xs[1].bd));
}